

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

Scope * __thiscall
ByteCodeGenerator::FindScopeForSym
          (ByteCodeGenerator *this,Scope *symScope,Scope *scope,PropertyId *envIndex,
          FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  FuncInfo *pFVar3;
  undefined4 *puVar4;
  Scope *local_40;
  FuncInfo *funcInfo_local;
  PropertyId *envIndex_local;
  Scope *scope_local;
  Scope *symScope_local;
  ByteCodeGenerator *this_local;
  
  if (scope == (Scope *)0x0) {
    local_40 = this->currentScope;
  }
  else {
    local_40 = Scope::GetEnclosingScope(scope);
  }
  for (envIndex_local = (PropertyId *)local_40; envIndex_local != (PropertyId *)0x0;
      envIndex_local = (PropertyId *)Scope::GetEnclosingScope((Scope *)envIndex_local)) {
    pFVar3 = Scope::GetFunc((Scope *)envIndex_local);
    if (((pFVar3 != funcInfo) && (bVar2 = Scope::GetMustInstantiate((Scope *)envIndex_local), bVar2)
        ) && ((Scope *)envIndex_local != this->globalScope)) {
      *envIndex = *envIndex + 1;
    }
    if (((Scope *)envIndex_local == symScope) ||
       (bVar2 = Scope::GetIsDynamic((Scope *)envIndex_local), bVar2)) break;
  }
  if (envIndex_local == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x7a7,"(scope)","scope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return (Scope *)envIndex_local;
}

Assistant:

Scope * ByteCodeGenerator::FindScopeForSym(Scope *symScope, Scope *scope, Js::PropertyId *envIndex, FuncInfo *funcInfo) const
{
    for (scope = scope ? scope->GetEnclosingScope() : currentScope; scope; scope = scope->GetEnclosingScope())
    {
        if (scope->GetFunc() != funcInfo
            && scope->GetMustInstantiate()
            && scope != this->globalScope)
        {
            (*envIndex)++;
        }
        if (scope == symScope || scope->GetIsDynamic())
        {
            break;
        }
    }

    Assert(scope);
    return scope;
}